

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::Copy(aiMetadata **_dest,aiMetadata *src)

{
  undefined1 auVar1 [16];
  aiMetadata *paVar2;
  ulong uVar3;
  aiMetadataEntry *paVar4;
  aiMetadataEntry *paVar5;
  byte *pbVar6;
  undefined4 *puVar7;
  undefined8 *puVar8;
  aiString *this;
  undefined8 *puVar9;
  aiMetadataEntry *out;
  aiMetadataEntry *in;
  uint i;
  aiMetadata *dest;
  aiMetadata *src_local;
  aiMetadata **_dest_local;
  
  if (((_dest != (aiMetadata **)0x0) && (src != (aiMetadata *)0x0)) && (src->mNumProperties != 0)) {
    paVar2 = aiMetadata::Alloc(src->mNumProperties);
    *_dest = paVar2;
    std::copy<aiString*,aiString*>(src->mKeys,src->mKeys + src->mNumProperties,paVar2->mKeys);
    auVar1 = ZEXT416(src->mNumProperties) * ZEXT816(0x10);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    paVar4 = (aiMetadataEntry *)operator_new__(uVar3);
    paVar2->mValues = paVar4;
    for (in._4_4_ = 0; in._4_4_ < src->mNumProperties; in._4_4_ = in._4_4_ + 1) {
      paVar4 = src->mValues + in._4_4_;
      paVar5 = paVar2->mValues + in._4_4_;
      paVar5->mType = paVar4->mType;
      switch(paVar2->mValues[in._4_4_].mType) {
      case AI_BOOL:
        pbVar6 = (byte *)operator_new(1);
        *pbVar6 = *paVar4->mData & 1;
        paVar5->mData = pbVar6;
        break;
      case AI_INT32:
        puVar7 = (undefined4 *)operator_new(4);
        *puVar7 = *paVar4->mData;
        paVar5->mData = puVar7;
        break;
      case AI_UINT64:
        puVar8 = (undefined8 *)operator_new(8);
        *puVar8 = *paVar4->mData;
        paVar5->mData = puVar8;
        break;
      case AI_FLOAT:
        puVar7 = (undefined4 *)operator_new(4);
        *puVar7 = *paVar4->mData;
        paVar5->mData = puVar7;
        break;
      case AI_DOUBLE:
        puVar8 = (undefined8 *)operator_new(8);
        *puVar8 = *paVar4->mData;
        paVar5->mData = puVar8;
        break;
      case AI_AISTRING:
        this = (aiString *)operator_new(0x404);
        aiString::aiString(this,(aiString *)paVar4->mData);
        paVar5->mData = this;
        break;
      case AI_AIVECTOR3D:
        puVar9 = (undefined8 *)operator_new(0xc);
        puVar8 = (undefined8 *)paVar4->mData;
        *puVar9 = *puVar8;
        *(undefined4 *)(puVar9 + 1) = *(undefined4 *)(puVar8 + 1);
        paVar5->mData = puVar9;
      }
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiMetadata** _dest, const aiMetadata* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    if ( 0 == src->mNumProperties ) {
        return;
    }

    aiMetadata* dest = *_dest = aiMetadata::Alloc( src->mNumProperties );
    std::copy(src->mKeys, src->mKeys + src->mNumProperties, dest->mKeys);

    dest->mValues = new aiMetadataEntry[src->mNumProperties];
    for (unsigned int i = 0; i < src->mNumProperties; ++i) {
        aiMetadataEntry& in = src->mValues[i];
        aiMetadataEntry& out = dest->mValues[i];
        out.mType = in.mType;
        switch (dest->mValues[i].mType) {
            case AI_BOOL:
                out.mData = new bool(*static_cast<bool*>(in.mData));
                break;
            case AI_INT32:
                out.mData = new int32_t(*static_cast<int32_t*>(in.mData));
                break;
            case AI_UINT64:
                out.mData = new uint64_t(*static_cast<uint64_t*>(in.mData));
                break;
            case AI_FLOAT:
                out.mData = new float(*static_cast<float*>(in.mData));
                break;
            case AI_DOUBLE:
                out.mData = new double(*static_cast<double*>(in.mData));
                break;
            case AI_AISTRING:
                out.mData = new aiString(*static_cast<aiString*>(in.mData));
                break;
            case AI_AIVECTOR3D:
                out.mData = new aiVector3D(*static_cast<aiVector3D*>(in.mData));
                break;
            default:
                ai_assert(false);
                break;
        }
    }
}